

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

span<const_slang::SourceLibrary_*,_18446744073709551615UL> __thiscall
slang::BumpAllocator::copyFrom<slang::SourceLibrary_const*>
          (BumpAllocator *this,span<const_slang::SourceLibrary_*const,_18446744073709551615UL> src)

{
  span<const_slang::SourceLibrary_*,_18446744073709551615UL> *this_00;
  SourceLibrary **__dest;
  pointer __src;
  BumpAllocator *in_RDI;
  SourceLibrary **dest;
  size_type len;
  size_t in_stack_ffffffffffffffc8;
  SourceLibrary **__first;
  BumpAllocator *this_01;
  span<const_slang::SourceLibrary_*const,_18446744073709551615UL> local_20;
  span<const_slang::SourceLibrary_*,_18446744073709551615UL> local_10;
  
  this_01 = in_RDI;
  this_00 = (span<const_slang::SourceLibrary_*,_18446744073709551615UL> *)
            std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>::size
                      ((span<const_slang::SourceLibrary_*const,_18446744073709551615UL> *)0x3a3e57);
  if (this_00 == (span<const_slang::SourceLibrary_*,_18446744073709551615UL> *)0x0) {
    std::span<const_slang::SourceLibrary_*,_18446744073709551615UL>::span
              ((span<const_slang::SourceLibrary_*,_18446744073709551615UL> *)0x3a3e6e);
  }
  else {
    __dest = (SourceLibrary **)allocate(this_01,(size_t)this_00,in_stack_ffffffffffffffc8);
    __first = __dest;
    __src = std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>::data(&local_20);
    memcpy(__dest,__src,(long)this_00 << 3);
    std::span<const_slang::SourceLibrary_*,_18446744073709551615UL>::
    span<const_slang::SourceLibrary_**>(this_00,__first,(size_type)in_RDI);
  }
  return local_10;
}

Assistant:

[[nodiscard]] std::span<T> copyFrom(std::span<const T> src) {
        auto len = src.size();
        if (len == 0)
            return {};

        auto dest = reinterpret_cast<T*>(allocate(len * sizeof(T), alignof(T)));
        std::memcpy(dest, src.data(), len * sizeof(T));

        return std::span<T>(dest, len);
    }